

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirtyudp.h
# Opt level: O0

void __thiscall UdpReceiver::UdpReceiver(UdpReceiver *this,int port,int bufferSize)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  int bufferSize_local;
  int port_local;
  UdpReceiver *this_local;
  
  this->port = port;
  this->bufferSize = bufferSize;
  pcVar4 = (char *)calloc((long)this->bufferSize,1);
  this->buffer = pcVar4;
  iVar2 = socket(2,2,0);
  this->socketFile = iVar2;
  if (this->socketFile < 0) {
    error("ERROR: Could not open socket\n");
  }
  this->socketOptions = 1;
  setsockopt(this->socketFile,1,6,&this->socketOptions,4);
  memset(&this->serverAddress,0,0x10);
  (this->serverAddress).sin_family = 2;
  uVar3 = htonl(0);
  (this->serverAddress).sin_addr.s_addr = uVar3;
  uVar1 = htons((uint16_t)this->port);
  (this->serverAddress).sin_port = uVar1;
  iVar2 = bind(this->socketFile,(sockaddr *)&this->serverAddress,0x10);
  if (iVar2 < 0) {
    error("ERROR: There was an issue binding the socket");
  }
  this->clientLength = 0x10;
  return;
}

Assistant:

UdpReceiver(int port, int bufferSize) {
      this->port = port;
      this->bufferSize = bufferSize;
      this->buffer = (char*)calloc(this->bufferSize, sizeof(char));
      // create socket
      this->socketFile = socket(AF_INET, SOCK_DGRAM, 0);
      if(this->socketFile < 0) error("ERROR: Could not open socket\n");
      // speedhax
      this->socketOptions = 1;
      setsockopt( this->socketFile,
                  SOL_SOCKET,
                  SO_BROADCAST,
                  (const void*)&this->socketOptions,
                  sizeof(int));
      // construct server address
      bzero((char*)&this->serverAddress, sizeof(this->serverAddress));
      this->serverAddress.sin_family = AF_INET;
      this->serverAddress.sin_addr.s_addr = htonl(INADDR_ANY);
      this->serverAddress.sin_port = htons((unsigned short)this->port);
      // bind socket
      if(bind(this->socketFile,
              (struct sockaddr *)&this->serverAddress,
              sizeof(this->serverAddress)) < 0)
        error("ERROR: There was an issue binding the socket");
      this->clientLength = sizeof(this->clientAddress);
    }